

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

int ltf8_decode(cram_fd *fd,int64_t *val_p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  int64_t val;
  int c;
  int64_t *val_p_local;
  cram_fd *fd_local;
  
  uVar1 = hgetc(fd->fp);
  uVar9 = (ulong)(uVar1 & 0xff);
  if (uVar1 == 0xffffffff) {
    fd_local._4_4_ = -1;
  }
  else if (uVar9 < 0x80) {
    *val_p = uVar9;
    fd_local._4_4_ = 1;
  }
  else if (uVar9 < 0xc0) {
    uVar1 = hgetc(fd->fp);
    *val_p = (uVar9 & 0x3f) << 8 | (ulong)(uVar1 & 0xff);
    fd_local._4_4_ = 2;
  }
  else if (uVar9 < 0xe0) {
    uVar1 = hgetc(fd->fp);
    uVar2 = hgetc(fd->fp);
    *val_p = ((uVar9 & 0x1f) << 8 | (ulong)(uVar1 & 0xff)) << 8 | (ulong)(uVar2 & 0xff);
    fd_local._4_4_ = 3;
  }
  else if (uVar9 < 0xf0) {
    uVar1 = hgetc(fd->fp);
    uVar2 = hgetc(fd->fp);
    uVar3 = hgetc(fd->fp);
    *val_p = (((uVar9 & 0xf) << 8 | (ulong)(uVar1 & 0xff)) << 8 | (ulong)(uVar2 & 0xff)) << 8 |
             (ulong)(uVar3 & 0xff);
    fd_local._4_4_ = 4;
  }
  else if (uVar9 < 0xf8) {
    uVar1 = hgetc(fd->fp);
    uVar2 = hgetc(fd->fp);
    uVar3 = hgetc(fd->fp);
    uVar4 = hgetc(fd->fp);
    *val_p = ((((uVar9 & 7) << 8 | (ulong)(uVar1 & 0xff)) << 8 | (ulong)(uVar2 & 0xff)) << 8 |
             (ulong)(uVar3 & 0xff)) << 8 | (ulong)(uVar4 & 0xff);
    fd_local._4_4_ = 5;
  }
  else if (uVar9 < 0xfc) {
    uVar1 = hgetc(fd->fp);
    uVar2 = hgetc(fd->fp);
    uVar3 = hgetc(fd->fp);
    uVar4 = hgetc(fd->fp);
    uVar5 = hgetc(fd->fp);
    *val_p = (((((uVar9 & 3) << 8 | (ulong)(uVar1 & 0xff)) << 8 | (ulong)(uVar2 & 0xff)) << 8 |
              (ulong)(uVar3 & 0xff)) << 8 | (ulong)(uVar4 & 0xff)) << 8 | (ulong)(uVar5 & 0xff);
    fd_local._4_4_ = 6;
  }
  else if (uVar9 < 0xfe) {
    uVar1 = hgetc(fd->fp);
    uVar2 = hgetc(fd->fp);
    uVar3 = hgetc(fd->fp);
    uVar4 = hgetc(fd->fp);
    uVar5 = hgetc(fd->fp);
    uVar6 = hgetc(fd->fp);
    *val_p = ((((((uVar9 & 1) << 8 | (ulong)(uVar1 & 0xff)) << 8 | (ulong)(uVar2 & 0xff)) << 8 |
               (ulong)(uVar3 & 0xff)) << 8 | (ulong)(uVar4 & 0xff)) << 8 | (ulong)(uVar5 & 0xff)) <<
             8 | (ulong)(uVar6 & 0xff);
    fd_local._4_4_ = 7;
  }
  else if (uVar9 < 0xff) {
    uVar1 = hgetc(fd->fp);
    uVar2 = hgetc(fd->fp);
    uVar3 = hgetc(fd->fp);
    uVar4 = hgetc(fd->fp);
    uVar5 = hgetc(fd->fp);
    uVar6 = hgetc(fd->fp);
    uVar7 = hgetc(fd->fp);
    *val_p = ((((((ulong)(uVar1 & 0xff) << 8 | (ulong)(uVar2 & 0xff)) << 8 | (ulong)(uVar3 & 0xff))
                << 8 | (ulong)(uVar4 & 0xff)) << 8 | (ulong)(uVar5 & 0xff)) << 8 |
             (ulong)(uVar6 & 0xff)) << 8 | (ulong)(uVar7 & 0xff);
    fd_local._4_4_ = 8;
  }
  else {
    uVar1 = hgetc(fd->fp);
    uVar2 = hgetc(fd->fp);
    uVar3 = hgetc(fd->fp);
    uVar4 = hgetc(fd->fp);
    uVar5 = hgetc(fd->fp);
    uVar6 = hgetc(fd->fp);
    uVar7 = hgetc(fd->fp);
    uVar8 = hgetc(fd->fp);
    *val_p = (((((((ulong)(uVar1 & 0xff) << 8 | (ulong)(uVar2 & 0xff)) << 8 | (ulong)(uVar3 & 0xff))
                 << 8 | (ulong)(uVar4 & 0xff)) << 8 | (ulong)(uVar5 & 0xff)) << 8 |
              (ulong)(uVar6 & 0xff)) << 8 | (ulong)(uVar7 & 0xff)) << 8 | (ulong)(uVar8 & 0xff);
    fd_local._4_4_ = 9;
  }
  return fd_local._4_4_;
}

Assistant:

int ltf8_decode(cram_fd *fd, int64_t *val_p) {
    int c = hgetc(fd->fp);
    int64_t val = (unsigned char)c;
    if (c == -1)
	return -1;

    if (val < 0x80) {
	*val_p =   val;
	return 1;

    } else if (val < 0xc0) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & (((1LL<<(6+8)))-1);
	return 2;

    } else if (val < 0xe0) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & ((1LL<<(5+2*8))-1);
	return 3;

    } else if (val < 0xf0) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & ((1LL<<(4+3*8))-1);
	return 4;

    } else if (val < 0xf8) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & ((1LL<<(3+4*8))-1);
	return 5;

    } else if (val < 0xfc) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & ((1LL<<(2+5*8))-1);
	return 6;

    } else if (val < 0xfe) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & ((1LL<<(1+6*8))-1);
	return 7;

    } else if (val < 0xff) {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val & ((1LL<<(7*8))-1);
	return 8;

    } else {
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	val = (val<<8) | (unsigned char)hgetc(fd->fp);
	*val_p = val;
    }

    return 9;
}